

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_json.hpp
# Opt level: O2

void jsoncons::encode_json<std::pair<int,std::__cxx11::string>,wchar_t>
               (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *val,basic_json_visitor<wchar_t> *encoder)

{
  ser_error *this;
  error_code ec_00;
  error_code ec;
  anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>_5
  local_28;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  local_28.common_ = (common_storage)0x4;
  encode_traits<std::pair<int,std::__cxx11::string>,wchar_t,void>::
  encode<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>>
            (val,encoder,
             (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
             &local_28.common_,&ec);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>::~basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
             &local_28.common_);
  if (ec._M_value == 0) {
    (*encoder->_vptr_basic_json_visitor[2])(encoder);
    return;
  }
  this = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = ec._M_value;
  ec_00._M_cat = ec._M_cat;
  ser_error::ser_error(this,ec_00);
  __cxa_throw(this,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void encode_json(const T& val, basic_json_visitor<CharT>& encoder)
    {
        std::error_code ec;
        encode_traits<T,CharT>::encode(val, encoder, basic_json<CharT>(), ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
        encoder.flush();
    }